

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::SuffixOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  string_t right_00;
  string_t left_00;
  byte bVar1;
  bool bVar2;
  string_t *psVar3;
  string_t *psVar4;
  bool *pbVar5;
  byte in_CL;
  Vector *in_RDX;
  Vector *in_RSI;
  bool *result_data;
  string_t *rdata;
  string_t *ldata;
  ValidityMask *mask;
  undefined1 fun_00;
  undefined7 uVar6;
  VectorType in_stack_ffffffffffffffcf;
  undefined1 uVar7;
  Vector *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  Vector::SetVectorType(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf);
  psVar3 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x13c79f4);
  psVar4 = ConstantVector::GetData<duckdb::string_t>((Vector *)0x13c7a03);
  pbVar5 = ConstantVector::GetData<bool>((Vector *)0x13c7a12);
  uVar6 = SUB87(pbVar5,0);
  uVar7 = (undefined1)((ulong)pbVar5 >> 0x38);
  bVar2 = ConstantVector::IsNull((Vector *)0x13c7a21);
  if ((!bVar2) && (bVar2 = ConstantVector::IsNull((Vector *)0x13c7a2f), !bVar2)) {
    mask = *(ValidityMask **)&psVar3->value;
    fun_00 = (undefined1)((ulong)*(undefined8 *)((long)&psVar3->value + 8) >> 0x38);
    ConstantVector::Validity(in_RDX);
    left_00.value._8_7_ = in_stack_ffffffffffffffe0;
    left_00.value._0_8_ = psVar3;
    left_00.value.inlined.inlined[0xb] = bVar1;
    right_00.value.pointer.prefix[3] = uVar7;
    right_00.value._0_7_ = uVar6;
    right_00.value.pointer.ptr = (char *)psVar4;
    bVar2 = BinaryStandardOperatorWrapper::
            Operation<bool,duckdb::SuffixOperator,duckdb::string_t,duckdb::string_t,bool>
                      ((bool)fun_00,left_00,right_00,mask,(idx_t)in_RSI);
    *(bool *)CONCAT17(uVar7,uVar6) = bVar2;
    return;
  }
  ConstantVector::SetNull(in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}